

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O2

void __thiscall BMRS_XZ<RemSP>::SecondScan(BMRS_XZ<RemSP> *this)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  Mat1i *pMVar7;
  uint64_t *puVar8;
  uint *puVar9;
  Run *pRVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  Run *pRVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar17 = (long)*(int *)&pMVar6->field_0xc;
  uVar3 = *(uint *)&pMVar6->field_0x8;
  pRVar19 = (this->data_runs).runs;
  uVar11 = (long)(int)uVar3 / 2 & 0xffffffff;
  puVar8 = (this->data_compressed).bits;
  if ((int)((long)(int)uVar3 / 2) < 1) {
    uVar11 = 0;
  }
  lVar20 = 1;
  lVar22 = 0;
  for (uVar15 = 0; puVar9 = RemSP::P_, uVar15 != uVar11; uVar15 = uVar15 + 1) {
    iVar4 = (this->data_compressed).data_width;
    iVar13 = (int)uVar15 * iVar4;
    lVar16 = **(long **)&pMVar7->field_0x48 * lVar22 + *(long *)&pMVar7->field_0x10;
    lVar14 = **(long **)&pMVar7->field_0x48 * lVar20 + *(long *)&pMVar7->field_0x10;
    lVar24 = 0;
    pRVar10 = pRVar19;
    do {
      pRVar19 = pRVar10;
      uVar1 = pRVar19->start_pos;
      if ((ulong)uVar1 == 0xffff) {
        lVar18 = (long)(int)lVar24;
        for (lVar12 = lVar18; lVar12 < lVar17; lVar12 = lVar12 + 1) {
          *(undefined4 *)(lVar16 + lVar12 * 4) = 0;
        }
        for (; lVar18 < lVar17; lVar18 = lVar18 + 1) {
          *(undefined4 *)(lVar14 + lVar18 * 4) = 0;
        }
        pRVar19 = pRVar19 + 1;
      }
      else {
        uVar2 = pRVar19->end_pos;
        uVar5 = puVar9[pRVar19->label];
        for (lVar24 = (long)(int)lVar24; lVar24 < (long)(ulong)uVar1; lVar24 = lVar24 + 1) {
          *(undefined4 *)(lVar16 + lVar24 * 4) = 0;
          *(undefined4 *)(lVar14 + lVar24 * 4) = 0;
        }
        for (; lVar24 < (long)(ulong)uVar2; lVar24 = lVar24 + 1) {
          lVar12 = (long)((int)(uint)lVar24 >> 6);
          uVar21 = (uint)lVar24 & 0x3f;
          uVar23 = uVar5;
          if ((puVar8[iVar13 * 2 + lVar12] >> uVar21 & 1) == 0) {
            uVar23 = 0;
          }
          *(uint *)(lVar16 + lVar24 * 4) = uVar23;
          uVar23 = uVar5;
          if ((puVar8[(long)(iVar13 * 2) + iVar4 + lVar12] >> uVar21 & 1) == 0) {
            uVar23 = 0;
          }
          *(uint *)(lVar14 + lVar24 * 4) = uVar23;
        }
      }
      pRVar10 = pRVar19 + 1;
    } while (uVar1 != 0xffff);
    lVar22 = lVar22 + 2;
    lVar20 = lVar20 + 2;
  }
  if ((uVar3 & 1) != 0) {
    lVar20 = (long)(int)(uVar3 - 1) * **(long **)&pMVar7->field_0x48 + *(long *)&pMVar7->field_0x10;
    uVar11 = 0;
    do {
      uVar1 = pRVar19->start_pos;
      uVar15 = (ulong)uVar1;
      if (uVar15 == 0xffff) {
        for (lVar22 = (long)(int)uVar11; lVar22 < lVar17; lVar22 = lVar22 + 1) {
          *(undefined4 *)(lVar20 + lVar22 * 4) = 0;
        }
      }
      else {
        uVar2 = pRVar19->end_pos;
        uVar3 = puVar9[pRVar19->label];
        for (lVar22 = (long)(int)uVar11; lVar22 < (long)uVar15; lVar22 = lVar22 + 1) {
          *(undefined4 *)(lVar20 + lVar22 * 4) = 0;
        }
        for (; uVar11 = uVar15, uVar15 < uVar2; uVar15 = uVar15 + 1) {
          *(uint *)(lVar20 + uVar15 * 4) = uVar3;
        }
      }
      pRVar19 = pRVar19 + 1;
    } while (uVar1 != 0xffff);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }